

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OctreeTracer.cpp
# Opt level: O0

void __thiscall
OctreeTracer::create_beam_graphics_pipeline(OctreeTracer *this,shared_ptr<myvk::Device> *device)

{
  initializer_list<VkPipelineShaderStageCreateInfo> __l;
  initializer_list<VkDynamicState> __l_00;
  size_type in_RDI;
  GraphicsPipelineState pipeline_state;
  vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
  shader_stages;
  shared_ptr<myvk::ShaderModule> frag_shader_module;
  shared_ptr<myvk::ShaderModule> vert_shader_module;
  uint32_t kOctreeTracerBeamFragSpv [2774];
  shared_ptr<myvk::ShaderModule> *in_stack_ffffffffffffd088;
  vector<VkDynamicState,_std::allocator<VkDynamicState>_> *dynamic_states;
  shared_ptr<myvk::ShaderModule> *in_stack_ffffffffffffd090;
  GraphicsPipelineState *this_00;
  VkSpecializationInfo *in_stack_ffffffffffffd0a0;
  pointer this_01;
  undefined8 in_stack_ffffffffffffd0a8;
  VkShaderStageFlagBits stage;
  VertexInputState *this_02;
  ShaderModule *in_stack_ffffffffffffd0b0;
  allocator_type *__a;
  vector<VkDynamicState,_std::allocator<VkDynamicState>_> *this_03;
  iterator pVVar1;
  allocator<VkDynamicState> local_2f11;
  undefined4 local_2f10;
  undefined4 local_2f0c;
  undefined8 in_stack_ffffffffffffd0f8;
  ColorBlendState *in_stack_ffffffffffffd100;
  uint32_t in_stack_ffffffffffffd10c;
  uint32_t *in_stack_ffffffffffffd110;
  Ptr<Device> *in_stack_ffffffffffffd118;
  RasterizationState local_2ee0;
  pointer local_2ea0;
  pointer pVStack_2e98;
  pointer local_2e90;
  pointer local_2e88;
  pointer pVStack_2e80;
  pointer local_2e78;
  VkStructureType local_2e70;
  void *local_2e68;
  VkPipelineVertexInputStateCreateFlags local_2e60;
  uint32_t local_2e5c;
  VkVertexInputBindingDescription *local_2e58;
  uint32_t local_2e50;
  uint32_t subpass;
  bool bVar2;
  undefined7 in_stack_ffffffffffffd1c1;
  VkStructureType VVar3;
  undefined4 in_stack_ffffffffffffd1cc;
  Ptr<RenderPass> *render_pass;
  VkPipelineInputAssemblyStateCreateFlags VVar4;
  VkPrimitiveTopology VVar5;
  ViewportState local_2df0;
  MultisampleState local_2d88;
  undefined4 local_2d50;
  undefined8 local_2d48;
  undefined4 local_2d40;
  undefined4 local_2d3c;
  undefined4 local_2d38;
  undefined4 local_2d34;
  undefined4 local_2d30;
  undefined4 local_2d2c;
  undefined8 uStack_2d28;
  undefined4 uStack_2d20;
  undefined4 local_2d1c;
  undefined4 uStack_2d18;
  pointer pVStack_2d14;
  undefined8 uStack_2d0c;
  undefined4 uStack_2d04;
  undefined4 local_2d00;
  undefined4 uStack_2cfc;
  pointer pVStack_2cf8;
  undefined4 local_2cf0;
  undefined4 local_2cec;
  undefined1 local_2ce8;
  undefined8 local_2ce0;
  pointer pVStack_2cd8;
  float local_2cd0 [4];
  undefined8 local_2cc0;
  undefined4 local_2cb8;
  undefined4 local_2cb4;
  undefined4 local_2cb0;
  undefined4 local_2cac;
  undefined8 local_2ca8;
  undefined8 local_2ca0;
  pointer pVStack_2c98;
  undefined1 local_2c90;
  vector<VkDynamicState,_std::allocator<VkDynamicState>_> local_2c88;
  undefined4 local_2c70;
  undefined8 local_2c68;
  undefined4 local_2c60;
  undefined4 local_2c5c;
  undefined8 local_2c58;
  undefined1 local_2c50;
  allocator<VkPipelineShaderStageCreateInfo> local_2c41;
  undefined1 local_2c40 [48];
  allocator_type local_2c10 [48];
  undefined1 *local_2be0;
  undefined8 local_2bd8;
  vector<VkDynamicState,_std::allocator<VkDynamicState>_> local_2bb8;
  VkPipelineShaderStageCreateInfo local_2b98;
  undefined1 local_2b68 [11112];
  
  stage = (VkShaderStageFlagBits)((ulong)in_stack_ffffffffffffd0a8 >> 0x20);
  memcpy(local_2b68,&DAT_003cb780,0x2b58);
  std::shared_ptr<myvk::ShaderModule>::shared_ptr((shared_ptr<myvk::ShaderModule> *)0x162eba);
  std::shared_ptr<myvk::ShaderModule>::shared_ptr((shared_ptr<myvk::ShaderModule> *)0x162ec7);
  myvk::ShaderModule::Create
            (in_stack_ffffffffffffd118,in_stack_ffffffffffffd110,in_stack_ffffffffffffd10c);
  pVVar1 = &local_2b98;
  std::shared_ptr<myvk::ShaderModule>::operator=
            (in_stack_ffffffffffffd090,in_stack_ffffffffffffd088);
  std::shared_ptr<myvk::ShaderModule>::~shared_ptr((shared_ptr<myvk::ShaderModule> *)0x162f0e);
  myvk::ShaderModule::Create
            (in_stack_ffffffffffffd118,in_stack_ffffffffffffd110,in_stack_ffffffffffffd10c);
  this_03 = &local_2bb8;
  std::shared_ptr<myvk::ShaderModule>::operator=
            (in_stack_ffffffffffffd090,in_stack_ffffffffffffd088);
  std::shared_ptr<myvk::ShaderModule>::~shared_ptr((shared_ptr<myvk::ShaderModule> *)0x162f56);
  std::__shared_ptr_access<myvk::ShaderModule,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<myvk::ShaderModule,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x162f63);
  myvk::ShaderModule::GetPipelineShaderStageCreateInfo
            (in_stack_ffffffffffffd0b0,stage,in_stack_ffffffffffffd0a0);
  __a = local_2c10;
  std::__shared_ptr_access<myvk::ShaderModule,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<myvk::ShaderModule,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x162f98);
  myvk::ShaderModule::GetPipelineShaderStageCreateInfo
            (in_stack_ffffffffffffd0b0,stage,in_stack_ffffffffffffd0a0);
  local_2be0 = local_2c40;
  local_2bd8 = 2;
  std::allocator<VkPipelineShaderStageCreateInfo>::allocator
            ((allocator<VkPipelineShaderStageCreateInfo> *)0x162fde);
  __l._M_len = in_RDI;
  __l._M_array = pVVar1;
  std::vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>::
  vector((vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
          *)this_03,__l,__a);
  std::allocator<VkPipelineShaderStageCreateInfo>::~allocator(&local_2c41);
  local_2ee0.m_create_info.sType = VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_CREATE_INFO;
  local_2ee0.m_create_info.pNext = (void *)0x0;
  local_2ee0.m_create_info.flags = 0;
  local_2ee0.m_create_info.depthClampEnable = 0;
  local_2ee0.m_create_info.rasterizerDiscardEnable = 0;
  local_2ee0.m_create_info.polygonMode = VK_POLYGON_MODE_FILL;
  local_2ee0.m_create_info.cullMode = 0;
  local_2ee0.m_create_info.frontFace = VK_FRONT_FACE_COUNTER_CLOCKWISE;
  local_2ee0.m_create_info.depthBiasEnable = 0;
  local_2ee0.m_create_info.depthBiasConstantFactor = 0.0;
  local_2ee0.m_create_info.depthBiasClamp = 0.0;
  local_2ee0.m_create_info.depthBiasSlopeFactor = 0.0;
  local_2ee0.m_create_info.lineWidth = 0.0;
  this_02 = (VertexInputState *)&local_2ea0;
  this_01 = (pointer)0x0;
  local_2ea0 = (pointer)0x0;
  pVStack_2e98 = (pointer)0x0;
  local_2e90 = (pointer)0x0;
  std::vector<VkVertexInputBindingDescription,_std::allocator<VkVertexInputBindingDescription>_>::
  vector((vector<VkVertexInputBindingDescription,_std::allocator<VkVertexInputBindingDescription>_>
          *)0x1630cd);
  local_2e88 = (pointer)0x0;
  local_2e78 = (pointer)0x0;
  pVStack_2e80 = this_01;
  std::vector<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
  ::vector((vector<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
            *)0x1630f3);
  local_2e70 = VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO;
  local_2e68 = (void *)0x0;
  local_2e60 = 0;
  local_2e5c = 0;
  local_2e58 = (VkVertexInputBindingDescription *)0x0;
  local_2e50 = 0;
  subpass = 0;
  bVar2 = false;
  VVar3 = VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO;
  render_pass = (Ptr<RenderPass> *)0x0;
  VVar4 = 0;
  VVar5 = VK_PRIMITIVE_TOPOLOGY_POINT_LIST;
  local_2df0.m_viewports.super__Vector_base<VkViewport,_std::allocator<VkViewport>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2df0.m_viewports.super__Vector_base<VkViewport,_std::allocator<VkViewport>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2df0.m_viewports.super__Vector_base<VkViewport,_std::allocator<VkViewport>_>._M_impl.
  super__Vector_impl_data._M_finish = this_01;
  std::vector<VkViewport,_std::allocator<VkViewport>_>::vector
            ((vector<VkViewport,_std::allocator<VkViewport>_> *)0x1631e6);
  local_2df0.m_scissors.super__Vector_base<VkRect2D,_std::allocator<VkRect2D>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2df0.m_scissors.super__Vector_base<VkRect2D,_std::allocator<VkRect2D>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2df0.m_scissors.super__Vector_base<VkRect2D,_std::allocator<VkRect2D>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)this_01;
  std::vector<VkRect2D,_std::allocator<VkRect2D>_>::vector
            ((vector<VkRect2D,_std::allocator<VkRect2D>_> *)0x16320c);
  local_2df0.m_create_info.sType = VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO;
  local_2df0.m_create_info.pNext = (void *)0x0;
  local_2df0.m_create_info.flags = 0;
  local_2df0.m_create_info.viewportCount = 0;
  local_2df0.m_create_info.pViewports = (VkViewport *)0x0;
  local_2df0.m_create_info.scissorCount = 0;
  local_2df0.m_create_info.pScissors = (VkRect2D *)0x0;
  local_2df0.m_enable = false;
  local_2d88.m_create_info.sType = VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO;
  local_2d88.m_create_info.pNext = (void *)0x0;
  local_2d88.m_create_info.flags = 0;
  local_2d88.m_create_info.rasterizationSamples = 0;
  local_2d88.m_create_info.sampleShadingEnable = 0;
  local_2d88.m_create_info.minSampleShading = 0.0;
  local_2d88.m_create_info.pSampleMask = (VkSampleMask *)0x0;
  local_2d88.m_create_info.alphaToCoverageEnable = 0;
  local_2d88.m_create_info.alphaToOneEnable = 0;
  local_2d88.m_enable = false;
  local_2d50 = 0x19;
  local_2d48 = 0;
  local_2d40 = 0;
  local_2d3c = 0;
  local_2d38 = 0;
  local_2d34 = 0;
  local_2d30 = 0;
  local_2d2c = 0;
  uStack_2d18 = 0;
  uStack_2d28 = 0;
  uStack_2d20 = SUB84(this_01,0);
  local_2d1c = (undefined4)((ulong)this_01 >> 0x20);
  uStack_2cfc = 0;
  uStack_2d0c = 0;
  local_2cf0 = 0;
  local_2cec = 0;
  local_2ce8 = 0;
  local_2ce0 = 0;
  local_2cd0._0_8_ = 0;
  pVStack_2d14 = this_01;
  uStack_2d04 = uStack_2d20;
  local_2d00 = local_2d1c;
  pVStack_2cf8 = this_01;
  pVStack_2cd8 = this_01;
  std::
  vector<VkPipelineColorBlendAttachmentState,_std::allocator<VkPipelineColorBlendAttachmentState>_>
  ::vector((vector<VkPipelineColorBlendAttachmentState,_std::allocator<VkPipelineColorBlendAttachmentState>_>
            *)0x16338e);
  local_2cd0[2] = 3.64338e-44;
  local_2cc0 = 0;
  local_2cb8 = 0;
  local_2cb4 = 0;
  local_2cb0 = 0;
  local_2cac = 0;
  local_2ca8 = 0;
  local_2ca0 = 0;
  local_2c90 = 0;
  local_2c88.super__Vector_base<VkDynamicState,_std::allocator<VkDynamicState>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2c88.super__Vector_base<VkDynamicState,_std::allocator<VkDynamicState>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pVStack_2c98 = this_01;
  local_2c88.super__Vector_base<VkDynamicState,_std::allocator<VkDynamicState>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)this_01;
  std::vector<VkDynamicState,_std::allocator<VkDynamicState>_>::vector
            ((vector<VkDynamicState,_std::allocator<VkDynamicState>_> *)0x163413);
  local_2c70 = 0x1b;
  local_2c68 = 0;
  local_2c60 = 0;
  local_2c5c = 0;
  local_2c58 = 0;
  local_2c50 = 0;
  myvk::GraphicsPipelineState::VertexInputState::Enable(this_02);
  myvk::GraphicsPipelineState::InputAssemblyState::Enable
            ((InputAssemblyState *)&stack0xffffffffffffd1c8,VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST,0);
  myvk::GraphicsPipelineState::ViewportState::Enable(&local_2df0,1,1);
  myvk::GraphicsPipelineState::RasterizationState::Initialize
            (&local_2ee0,VK_POLYGON_MODE_FILL,VK_FRONT_FACE_COUNTER_CLOCKWISE,1);
  myvk::GraphicsPipelineState::MultisampleState::Enable(&local_2d88,VK_SAMPLE_COUNT_1_BIT);
  myvk::GraphicsPipelineState::ColorBlendState::Enable
            (in_stack_ffffffffffffd100,SUB84(in_stack_ffffffffffffd0f8,4),
             (VkBool32)in_stack_ffffffffffffd0f8);
  dynamic_states = &local_2c88;
  local_2f10 = 0;
  local_2f0c = 1;
  this_00 = (GraphicsPipelineState *)&local_2f11;
  std::allocator<VkDynamicState>::allocator((allocator<VkDynamicState> *)0x16350c);
  __l_00._M_len = in_RDI;
  __l_00._M_array = &pVVar1->sType;
  std::vector<VkDynamicState,_std::allocator<VkDynamicState>_>::vector
            (this_03,__l_00,(allocator_type *)__a);
  myvk::GraphicsPipelineState::DynamicState::Enable((DynamicState *)this_00,dynamic_states);
  std::vector<VkDynamicState,_std::allocator<VkDynamicState>_>::~vector
            ((vector<VkDynamicState,_std::allocator<VkDynamicState>_> *)this_01);
  std::allocator<VkDynamicState>::~allocator(&local_2f11);
  myvk::GraphicsPipeline::Create
            ((Ptr<PipelineLayout> *)CONCAT44(VVar5,VVar4),render_pass,
             (vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
              *)CONCAT44(in_stack_ffffffffffffd1cc,VVar3),
             (GraphicsPipelineState *)CONCAT71(in_stack_ffffffffffffd1c1,bVar2),subpass);
  std::shared_ptr<myvk::GraphicsPipeline>::operator=
            ((shared_ptr<myvk::GraphicsPipeline> *)this_00,
             (shared_ptr<myvk::GraphicsPipeline> *)dynamic_states);
  std::shared_ptr<myvk::GraphicsPipeline>::~shared_ptr
            ((shared_ptr<myvk::GraphicsPipeline> *)0x1635a3);
  myvk::GraphicsPipelineState::~GraphicsPipelineState(this_00);
  std::vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>::
  ~vector((vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
           *)this_01);
  std::shared_ptr<myvk::ShaderModule>::~shared_ptr((shared_ptr<myvk::ShaderModule> *)0x1635ca);
  std::shared_ptr<myvk::ShaderModule>::~shared_ptr((shared_ptr<myvk::ShaderModule> *)0x1635d7);
  return;
}

Assistant:

void OctreeTracer::create_beam_graphics_pipeline(const std::shared_ptr<myvk::Device> &device) {
	constexpr uint32_t kOctreeTracerBeamFragSpv[] = {
#include "spirv/octree_tracer_beam.frag.u32"
	};
	std::shared_ptr<myvk::ShaderModule> vert_shader_module, frag_shader_module;
	vert_shader_module = myvk::ShaderModule::Create(device, kQuadVertSpv, sizeof(kQuadVertSpv));
	frag_shader_module = myvk::ShaderModule::Create(device, kOctreeTracerBeamFragSpv, sizeof(kOctreeTracerBeamFragSpv));

	std::vector<VkPipelineShaderStageCreateInfo> shader_stages = {
	    vert_shader_module->GetPipelineShaderStageCreateInfo(VK_SHADER_STAGE_VERTEX_BIT),
	    frag_shader_module->GetPipelineShaderStageCreateInfo(VK_SHADER_STAGE_FRAGMENT_BIT)};

	myvk::GraphicsPipelineState pipeline_state = {};
	pipeline_state.m_vertex_input_state.Enable();
	pipeline_state.m_input_assembly_state.Enable(VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST);
	pipeline_state.m_viewport_state.Enable(1, 1);
	pipeline_state.m_rasterization_state.Initialize(VK_POLYGON_MODE_FILL, VK_FRONT_FACE_COUNTER_CLOCKWISE,
	                                                VK_CULL_MODE_FRONT_BIT);
	pipeline_state.m_multisample_state.Enable(VK_SAMPLE_COUNT_1_BIT);
	pipeline_state.m_color_blend_state.Enable(1, VK_FALSE);
	pipeline_state.m_dynamic_state.Enable({VK_DYNAMIC_STATE_VIEWPORT, VK_DYNAMIC_STATE_SCISSOR});

	m_beam_graphics_pipeline =
	    myvk::GraphicsPipeline::Create(m_beam_pipeline_layout, m_beam_render_pass, shader_stages, pipeline_state, 0);
}